

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSymm.c
# Opt level: O1

void Ntk_SymTryRandomFlips(word *pFun,word *pNpn,int nVars)

{
  ulong uVar1;
  long lVar2;
  uint uVar3;
  ulong *__dest;
  ulong uVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  ulong *puVar13;
  ulong *puVar14;
  size_t __nmemb;
  
  uVar8 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    uVar8 = 1;
  }
  __nmemb = (size_t)(int)uVar8;
  __dest = (ulong *)calloc(__nmemb,8);
  if (0 < (int)uVar8) {
    memcpy(__dest,pFun,__nmemb * 8);
  }
  uVar9 = (ulong)uVar8;
  lVar10 = 0;
  do {
    lVar2 = (long)(int)(&DAT_00985970)[lVar10] % (long)(nVars + -1);
    bVar5 = (byte)lVar2;
    iVar7 = (int)lVar2;
    if (uVar8 == 1) {
      bVar5 = (byte)(1 << (bVar5 & 0x1f));
      *__dest = (s_Truths6[iVar7] & *__dest) >> (bVar5 & 0x3f) |
                *__dest << (bVar5 & 0x3f) & s_Truths6[iVar7];
    }
    else if (iVar7 < 6) {
      if (0 < (int)uVar8) {
        uVar4 = s_Truths6[iVar7];
        uVar12 = 0;
        do {
          bVar6 = (byte)(1 << (bVar5 & 0x1f));
          __dest[uVar12] =
               (__dest[uVar12] & uVar4) >> (bVar6 & 0x3f) | __dest[uVar12] << (bVar6 & 0x3f) & uVar4
          ;
          uVar12 = uVar12 + 1;
        } while (uVar9 != uVar12);
      }
    }
    else if (0 < (int)uVar8) {
      bVar5 = (byte)(iVar7 + -6);
      uVar3 = 1 << (bVar5 & 0x1f);
      iVar11 = 2 << (bVar5 & 0x1f);
      uVar4 = 1;
      if (1 < (int)uVar3) {
        uVar4 = (ulong)uVar3;
      }
      puVar13 = __dest + (int)uVar3;
      puVar14 = __dest;
      do {
        if (iVar7 + -6 != 0x1f) {
          uVar12 = 0;
          do {
            uVar1 = puVar14[uVar12];
            puVar14[uVar12] = puVar13[uVar12];
            puVar13[uVar12] = uVar1;
            uVar12 = uVar12 + 1;
          } while (uVar4 != uVar12);
        }
        puVar14 = puVar14 + iVar11;
        puVar13 = puVar13 + iVar11;
      } while (puVar14 < __dest + __nmemb);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x10);
  do {
    if ((int)uVar9 < 1) goto LAB_00317ce8;
    lVar10 = uVar9 - 1;
    lVar2 = uVar9 - 1;
    uVar9 = uVar9 - 1;
  } while (pNpn[lVar2] == __dest[lVar10]);
  if (__dest[lVar10] <= pNpn[lVar2]) {
    __assert_fail("Abc_TtCompareRev(pNpn, pFunT, nWords) != 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSymm.c"
                  ,0x105,"void Ntk_SymTryRandomFlips(word *, word *, int)");
  }
LAB_00317ce8:
  if (__dest == (ulong *)0x0) {
    return;
  }
  free(__dest);
  return;
}

Assistant:

void Ntk_SymTryRandomFlips( word * pFun, word * pNpn, int nVars )
{
    int Rand[16] = { 17290, 20203, 19027, 12035, 14687, 10920, 10413, 261, 2072, 16899, 4480, 6192, 3978, 8343, 745, 1370 };
    int i, nWords = Abc_TtWordNum(nVars);
    word * pFunT = ABC_CALLOC( word, nWords );
    Abc_TtCopy( pFunT, pFun, nWords, 0 );
    for ( i = 0; i < 16; i++ )
        Abc_TtFlip( pFunT, nWords, Rand[i] % (nVars-1) );
    assert( Abc_TtCompareRev(pNpn, pFunT, nWords) != 1 );
    ABC_FREE( pFunT );
}